

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O2

div_t __thiscall
OpenMD::RectMatrix<double,_3U,_3U>::div(RectMatrix<double,_3U,_3U> *this,int __numer,int __denom)

{
  uint i;
  long lVar1;
  div_t dVar2;
  uint j;
  long lVar3;
  double in_XMM0_Qa;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar3 = 0; lVar3 != 3; lVar3 = lVar3 + 1) {
      (*(double (*) [3])*(double (*) [3])this)[lVar3] =
           (*(double (*) [3])*(double (*) [3])this)[lVar3] / in_XMM0_Qa;
    }
    this = (RectMatrix<double,_3U,_3U> *)((long)this + 0x18);
  }
  dVar2.quot = 3;
  dVar2.rem = 0;
  return dVar2;
}

Assistant:

inline void div(Real s) {
      for (unsigned int i = 0; i < Row; i++)
        for (unsigned int j = 0; j < Col; j++)
          this->data_[i][j] /= s;
    }